

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcMechanicalFastener::IfcMechanicalFastener(IfcMechanicalFastener *this)

{
  IfcMechanicalFastener *this_local;
  
  STEP::Object::Object((Object *)&this->field_0x188,"IfcMechanicalFastener");
  IfcFastener::IfcFastener(&this->super_IfcFastener,&PTR_construction_vtable_24__00e92e48);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcMechanicalFastener,_2UL>::ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcMechanicalFastener,_2UL> *)
             &(this->super_IfcFastener).super_IfcElementComponent.field_0x158,
             &PTR_construction_vtable_24__00e92fd0);
  *(undefined8 *)
   &(this->super_IfcFastener).super_IfcElementComponent.super_IfcElement.super_IfcProduct.
    super_IfcObject = 0xe92cf0;
  *(undefined8 *)&this->field_0x188 = 0xe92e30;
  *(undefined8 *)
   &(this->super_IfcFastener).super_IfcElementComponent.super_IfcElement.super_IfcProduct.
    super_IfcObject.field_0x88 = 0xe92d18;
  (this->super_IfcFastener).super_IfcElementComponent.super_IfcElement.super_IfcProduct.
  super_IfcObject.super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>._vptr_ObjectHelper =
       (_func_int **)0xe92d40;
  *(undefined8 *)
   &(this->super_IfcFastener).super_IfcElementComponent.super_IfcElement.super_IfcProduct.
    super_IfcObject.field_0xd0 = 0xe92d68;
  *(undefined8 *)
   &(this->super_IfcFastener).super_IfcElementComponent.super_IfcElement.super_IfcProduct.
    field_0x100 = 0xe92d90;
  *(undefined8 *)&(this->super_IfcFastener).super_IfcElementComponent.super_IfcElement.field_0x138 =
       0xe92db8;
  *(undefined8 *)&(this->super_IfcFastener).super_IfcElementComponent.super_IfcElement.field_0x148 =
       0xe92de0;
  *(undefined8 *)&(this->super_IfcFastener).super_IfcElementComponent.field_0x158 = 0xe92e08;
  STEP::Maybe<double>::Maybe((Maybe<double> *)&(this->super_IfcFastener).field_0x168);
  STEP::Maybe<double>::Maybe(&this->NominalLength);
  return;
}

Assistant:

IfcMechanicalFastener() : Object("IfcMechanicalFastener") {}